

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_UInt16 UA_Server_run_iterate(UA_Server *server,UA_Boolean waitInternal)

{
  UA_DateTime UVar1;
  ulong local_68;
  size_t j;
  size_t k;
  size_t jobsSize;
  UA_Job *jobs;
  UA_ServerNetworkLayer *nl;
  size_t i;
  UA_DateTime UStack_30;
  UA_UInt16 timeout;
  UA_DateTime nextRepeated;
  UA_DateTime UStack_20;
  UA_Boolean dispatched;
  UA_DateTime now;
  UA_Server *pUStack_10;
  UA_Boolean waitInternal_local;
  UA_Server *server_local;
  
  now._7_1_ = waitInternal;
  pUStack_10 = server;
  UStack_20 = UA_DateTime_nowMonotonic();
  nextRepeated._7_1_ = 0;
  UStack_30 = processRepeatedJobs(pUStack_10,UStack_20,(UA_Boolean *)((long)&nextRepeated + 7));
  i._6_2_ = 0;
  if ((now._7_1_ & 1) != 0) {
    i._6_2_ = (UA_UInt16)((UStack_30 - UStack_20) / 10000);
  }
  for (nl = (UA_ServerNetworkLayer *)0x0;
      nl < (UA_ServerNetworkLayer *)(pUStack_10->config).networkLayersSize;
      nl = (UA_ServerNetworkLayer *)((long)&nl->handle + 1)) {
    jobs = (UA_Job *)((pUStack_10->config).networkLayers + (long)nl);
    jobsSize = 0;
    if (nl == (UA_ServerNetworkLayer *)((pUStack_10->config).networkLayersSize - 1)) {
      k = (*((UA_ServerNetworkLayer *)jobs)->getJobs)
                    ((UA_ServerNetworkLayer *)jobs,(UA_Job **)&jobsSize,i._6_2_);
    }
    else {
      k = (*((UA_ServerNetworkLayer *)jobs)->getJobs)
                    ((UA_ServerNetworkLayer *)jobs,(UA_Job **)&jobsSize,0);
    }
    for (j = 0; j < k; j = j + 1) {
      if (*(int *)(jobsSize + j * 0x20) == 2) {
        completeMessages(pUStack_10,(UA_Job *)(jobsSize + j * 0x20));
      }
    }
    for (local_68 = 0; local_68 < k; local_68 = local_68 + 1) {
      processJob(pUStack_10,(UA_Job *)(jobsSize + local_68 * 0x20));
    }
    if (k != 0) {
      free((void *)jobsSize);
    }
  }
  processDelayedCallbacks(pUStack_10);
  UVar1 = UA_DateTime_nowMonotonic();
  i._6_2_ = 0;
  if (UVar1 < UStack_30) {
    i._6_2_ = (UA_UInt16)((UStack_30 - UVar1) / 10000);
  }
  return i._6_2_;
}

Assistant:

UA_UInt16 UA_Server_run_iterate(UA_Server *server, UA_Boolean waitInternal) {
#ifdef UA_ENABLE_MULTITHREADING
    /* Run work assigned for the main thread */
    processMainLoopJobs(server);
#endif
    /* Process repeated work */
    UA_DateTime now = UA_DateTime_nowMonotonic();
    UA_Boolean dispatched = false; /* to wake up worker threads */
    UA_DateTime nextRepeated = processRepeatedJobs(server, now, &dispatched);

    UA_UInt16 timeout = 0;
    if(waitInternal)
        timeout = (UA_UInt16)((nextRepeated - now) / UA_MSEC_TO_DATETIME);

    /* Get work from the networklayer */
    for(size_t i = 0; i < server->config.networkLayersSize; ++i) {
        UA_ServerNetworkLayer *nl = &server->config.networkLayers[i];
        UA_Job *jobs = NULL;
        size_t jobsSize;
        /* only the last networklayer waits on the tieout */
        if(i == server->config.networkLayersSize-1)
            jobsSize = nl->getJobs(nl, &jobs, timeout);
        else
            jobsSize = nl->getJobs(nl, &jobs, 0);

        for(size_t k = 0; k < jobsSize; ++k) {
#ifdef UA_ENABLE_MULTITHREADING
            /* Filter out delayed work */
            if(jobs[k].type == UA_JOBTYPE_METHODCALL_DELAYED) {
                addDelayedJob(server, &jobs[k]);
                jobs[k].type = UA_JOBTYPE_NOTHING;
                continue;
            }
#endif
            /* Merge half-received messages */
            if(jobs[k].type == UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER)
                completeMessages(server, &jobs[k]);
        }

        /* Dispatch/process jobs */
        for(size_t j = 0; j < jobsSize; ++j) {
#ifdef UA_ENABLE_MULTITHREADING
            dispatchJob(server, &jobs[j]);
            dispatched = true;
#else
            processJob(server, &jobs[j]);
#endif
        }

        /* Clean up jobs list */
        if(jobsSize > 0)
            UA_free(jobs);
    }

#ifdef UA_ENABLE_MULTITHREADING
    /* Wake up worker threads */
    if(dispatched)
        pthread_cond_broadcast(&server->dispatchQueue_condition);
#else
    processDelayedCallbacks(server);
#endif

    now = UA_DateTime_nowMonotonic();
    timeout = 0;
    if(nextRepeated > now)
        timeout = (UA_UInt16)((nextRepeated - now) / UA_MSEC_TO_DATETIME);
    return timeout;
}